

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O2

void Handler_translation_L_Actor(AActor *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  uint uVar1;
  char *text;
  DWORD DVar2;
  long lVar3;
  FName local_54;
  FRemapTable CurrentTranslation;
  
  if (params[1].i == 0) {
    uVar1 = params[2].i;
    if (6 < uVar1) {
      I_Error("Translation must be in the range [0,%d]",6);
    }
    defaults->Translation = uVar1 | 0x30000;
  }
  else {
    FRemapTable::FRemapTable(&CurrentTranslation,0x100);
    FRemapTable::MakeIdentity(&CurrentTranslation);
    for (lVar3 = 1; lVar3 < params->i; lVar3 = lVar3 + 1) {
      text = params[lVar3 + 1].s;
      if (params->i == 2 && lVar3 == 1) {
        FName::FName(&local_54,text);
        DVar2 = R_FindCustomTranslation(&local_54);
        if (DVar2 != 0xffffffff) goto LAB_00504306;
      }
      FRemapTable::AddToTranslation(&CurrentTranslation,text);
    }
    DVar2 = FRemapTable::StoreTranslation(&CurrentTranslation,7);
LAB_00504306:
    defaults->Translation = DVar2;
    FRemapTable::~FRemapTable(&CurrentTranslation);
  }
  return;
}

Assistant:

DEFINE_PROPERTY(translation, L, Actor)
{
	PROP_INT_PARM(type, 0);

	if (type == 0)
	{
		PROP_INT_PARM(trans, 1);
		int max = 6;// (gameinfo.gametype == GAME_Strife || (info->GameFilter&GAME_Strife)) ? 6 : 2;
		if (trans < 0 || trans > max)
		{
			I_Error ("Translation must be in the range [0,%d]", max);
		}
		defaults->Translation = TRANSLATION(TRANSLATION_Standard, trans);
	}
	else 
	{
		FRemapTable CurrentTranslation;

		CurrentTranslation.MakeIdentity();
		for(int i = 1; i < PROP_PARM_COUNT; i++)
		{
			PROP_STRING_PARM(str, i);
			int tnum;
			if (i== 1 && PROP_PARM_COUNT == 2 && (tnum = R_FindCustomTranslation(str)) != -1)
			{
				defaults->Translation = tnum;
				return;
			}
			else
			{
				CurrentTranslation.AddToTranslation(str);
			}
		}
		defaults->Translation = CurrentTranslation.StoreTranslation (TRANSLATION_Decorate);
	}
}